

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmize.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  long lVar2;
  FILE *__stream;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  xm_context_t *ctx_00;
  size_t sVar6;
  size_t sVar7;
  undefined8 *in_RSI;
  int in_EDI;
  size_t k_1;
  size_t k;
  size_t j;
  size_t i;
  void *xmdata;
  FILE *out;
  FILE *in;
  xm_context_t *ctx;
  ulong local_50;
  ulong local_48;
  undefined8 in_stack_ffffffffffffffc0;
  uint32_t rate;
  ulong uVar8;
  ulong uVar9;
  xm_context_t **in_stack_ffffffffffffffd8;
  size_t *local_18;
  
  rate = (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (in_EDI < 3) {
    fprintf(_stderr,"Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n",*in_RSI);
    exit(1);
  }
  fprintf(_stderr,"%s: this format is highly non-portable. Check the README for more information.\n"
          ,*in_RSI);
  pFVar4 = fopen((char *)in_RSI[in_EDI + -2],"rb");
  if (pFVar4 == (FILE *)0x0) {
    fprintf(_stderr,"input file %s not readable (fopen)\n",in_RSI[in_EDI + -2]);
    exit(1);
  }
  iVar3 = fseek(pFVar4,0,2);
  if (iVar3 != 0) {
    fprintf(_stderr,"input file %s not seekable\n",in_RSI[in_EDI + -2]);
    exit(1);
  }
  sVar5 = ftell(pFVar4);
  ctx_00 = (xm_context_t *)malloc(sVar5);
  if (ctx_00 == (xm_context_t *)0x0) {
    fprintf(_stderr,"malloc failed to allocate %lu bytes\n",sVar5);
    exit(1);
  }
  rewind(pFVar4);
  sVar6 = fread(ctx_00,sVar5,1,pFVar4);
  if (sVar6 == 0) {
    fprintf(_stderr,"input file %s not readable (fread)\n",in_RSI[in_EDI + -2]);
    exit(1);
  }
  xm_create_context_safe(in_stack_ffffffffffffffd8,(char *)ctx_00,sVar5,rate);
  if (local_18 == (size_t *)0x0) {
    exit(1);
  }
  free(ctx_00);
  pFVar4 = fopen((char *)in_RSI[in_EDI + -1],"wb");
  if (pFVar4 == (FILE *)0x0) {
    fprintf(_stderr,"output file %s not writeable\n",in_RSI[in_EDI + -1]);
    exit(1);
  }
  iVar3 = strcmp("--zero-all-waveforms",(char *)in_RSI[1]);
  __stream = _stderr;
  if (iVar3 == 0) {
    uVar1 = *in_RSI;
    sVar7 = zero_waveforms(ctx_00);
    fprintf(__stream,"%s: zeroing waveforms, saved %lu bytes.\n",uVar1,sVar7);
  }
  for (uVar9 = 0; uVar9 < *(ushort *)((long)local_18 + 0xe); uVar9 = uVar9 + 1) {
    *(long *)(local_18[0x23] + uVar9 * 0x10 + 8) =
         *(long *)(local_18[0x23] + uVar9 * 0x10 + 8) - (long)local_18;
  }
  for (uVar9 = 0; uVar9 < (ushort)local_18[2]; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar8 < *(ushort *)(local_18[0x24] + uVar9 * 0xf8); uVar8 = uVar8 + 1) {
      if (1 < *(uint *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38 + 4)) {
        if (*(char *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38) == '\b') {
          for (local_48 = (ulong)(*(int *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) +
                                           uVar8 * 0x38 + 4) - 1); local_48 != 0;
              local_48 = local_48 - 1) {
            lVar2 = *(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38 + 0x30)
            ;
            *(char *)(lVar2 + local_48) =
                 *(char *)(lVar2 + local_48) -
                 *(char *)(*(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38
                                    + 0x30) + (local_48 - 1));
          }
        }
        else {
          for (local_50 = (ulong)(*(int *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) +
                                           uVar8 * 0x38 + 4) - 1); local_50 != 0;
              local_50 = local_50 - 1) {
            lVar2 = *(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38 + 0x30)
            ;
            *(short *)(lVar2 + local_50 * 2) =
                 *(short *)(lVar2 + local_50 * 2) -
                 *(short *)(*(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38
                                     + 0x30) + (local_50 - 1) * 2);
          }
        }
      }
      *(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38 + 0x30) =
           *(long *)(*(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) + uVar8 * 0x38 + 0x30) -
           (long)local_18;
    }
    *(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) =
         *(long *)(local_18[0x24] + uVar9 * 0xf8 + 0xf0) - (long)local_18;
  }
  local_18[0x23] = local_18[0x23] - (long)local_18;
  local_18[0x24] = local_18[0x24] - (long)local_18;
  local_18[0x2b] = local_18[0x2b] - (long)local_18;
  local_18[0x2d] = local_18[0x2d] - (long)local_18;
  sVar5 = fwrite(local_18,*local_18,1,pFVar4);
  if (sVar5 != 0) {
    fclose(pFVar4);
    fprintf(_stderr,"%s: done writing %lu bytes.\n",*in_RSI,*local_18);
    xm_free_context((xm_context_t *)0x102990);
    return 0;
  }
  fprintf(_stderr,"fwrite() failed writing %lu bytes\n",*local_18);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	FILE* in;
	FILE* out;
	void* xmdata;
	size_t i, j;

	if(argc < 3) FATAL("Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n", argv[0]);

	fprintf(stderr, "%s: this format is highly non-portable. Check the README for more information.\n", argv[0]);

	in = fopen(argv[argc - 2], "rb");
	if(in == NULL) FATAL("input file %s not readable (fopen)\n", argv[argc - 2]);
	if(fseek(in, 0, SEEK_END)) FATAL("input file %s not seekable\n", argv[argc - 2]);
	xmdata = malloc(i = ftell(in));
	if(xmdata == NULL) FATAL("malloc failed to allocate %lu bytes\n", i);
	rewind(in);
	if(!fread(xmdata, i, 1, in)) FATAL("input file %s not readable (fread)\n", argv[argc - 2]);
	xm_create_context_safe(&ctx, xmdata, i, 48000);
	if(ctx == NULL) exit(1);
	free(xmdata);

	out = fopen(argv[argc - 1], "wb");
	if(out == NULL) FATAL("output file %s not writeable\n", argv[argc - 1]);

	if(!strcmp("--zero-all-waveforms", argv[1])) {
		fprintf(stderr, "%s: zeroing waveforms, saved %lu bytes.\n", argv[0], zero_waveforms(ctx));
	}

	/* Ugly pointer offsetting ahead */

	for(i = 0; i < ctx->module.num_patterns; ++i) {
		OFFSET(ctx->module.patterns[i].slots);
	}

	for(i = 0; i < ctx->module.num_instruments; ++i) {
		for(j = 0; j < ctx->module.instruments[i].num_samples; ++j) {
			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if(ctx->module.instruments[i].samples[j].length > 1) {
					/* Half-ass delta encoding of samples, this compresses
					 * much better */
					if(ctx->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data8[k] -= ctx->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data16[k] -= ctx->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}

			OFFSET(ctx->module.instruments[i].samples[j].data8);
		}

		OFFSET(ctx->module.instruments[i].samples);
	}

	OFFSET(ctx->module.patterns);
	OFFSET(ctx->module.instruments);
	OFFSET(ctx->row_loop_count);
	OFFSET(ctx->channels);

	if(!fwrite(ctx, ctx->ctx_size, 1, out)) FATAL("fwrite() failed writing %lu bytes\n", ctx->ctx_size);
	fclose(out);
	fprintf(stderr, "%s: done writing %lu bytes.\n", argv[0], ctx->ctx_size);

	xm_free_context(ctx);
	return 0;
}